

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  uint uVar1;
  real *prVar2;
  runtime_error *this_00;
  long in_RDI;
  double dVar3;
  int j;
  double norm;
  undefined4 in_stack_ffffffffffffffc0;
  real in_stack_ffffffffffffffc4;
  DenseMatrix *in_stack_ffffffffffffffd0;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; (long)local_1c < *(long *)(in_RDI + 0x10); local_1c = local_1c + 1) {
    prVar2 = at(in_stack_ffffffffffffffd0,in_RDI,
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc4 = *prVar2;
    prVar2 = at(in_stack_ffffffffffffffd0,in_RDI,
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    local_18 = (double)(in_stack_ffffffffffffffc4 * *prVar2) + local_18;
  }
  uVar1 = std::isnan(local_18);
  if ((uVar1 & 1) == 0) {
    dVar3 = sqrt(local_18);
    return (float)dVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Encountered NaN.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return std::sqrt(norm);
}